

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseFile(X3DImporter *this,string *pFile,IOSystem *pIOHandler)

{
  FIReader *pFVar1;
  FIReader *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *pDVar4;
  _Alloc_hider _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *stream;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (this->mReader)._M_t.
  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
  super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl = (FIReader *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"rb",(allocator<char> *)&local_50);
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_70._M_dataplus._M_p);
  stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::~string((string *)&local_70);
  if (stream == (IOStream *)0x0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open X3D file ",pFile);
    std::operator+(&local_70,&local_50,".");
    DeadlyImportError::DeadlyImportError(pDVar4,&local_70);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  FIReader::create((FIReader *)&local_70,stream);
  _Var5._M_p = local_70._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)0x0;
  pFVar2 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (this->mReader)._M_t.
  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
  super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl = (FIReader *)_Var5._M_p;
  if (pFVar2 != (FIReader *)0x0) {
    (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[1])();
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
    _Var5._M_p = (pointer)(this->mReader)._M_t.
                          super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                          .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  }
  if ((FIReader *)_Var5._M_p != (FIReader *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"urn:web3d:x3d:fi-vocabulary-3.2",(allocator<char> *)&local_50);
    (*(((FIReader *)_Var5._M_p)->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader
      [0x15])(_Var5._M_p,&local_70,X3D_vocabulary_3_2);
    std::__cxx11::string::~string((string *)&local_70);
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"urn:web3d:x3d:fi-vocabulary-3.3",(allocator<char> *)&local_50);
    (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x15])
              (pFVar2,&local_70,X3D_vocabulary_3_3);
    std::__cxx11::string::~string((string *)&local_70);
    ParseNode_Root(this);
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    (this->mReader)._M_t.
    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
    super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl = pFVar1;
    if (pFVar2 != (FIReader *)0x0) {
      (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[1])();
    }
    (*stream->_vptr_IOStream[1])(stream);
    return;
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to create XML reader for file",pFile);
  std::operator+(&local_70,&local_50,".");
  DeadlyImportError::DeadlyImportError(pDVar4,&local_70);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::ParseFile(const std::string& pFile, IOSystem* pIOHandler)
{
    std::unique_ptr<FIReader> OldReader = std::move(mReader);// store current XMLreader.
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

	// Check whether we can read from the file
    if ( file.get() == nullptr )
    {
        throw DeadlyImportError( "Failed to open X3D file " + pFile + "." );
    }
	mReader = FIReader::create(file.get());
    if ( !mReader )
    {
        throw DeadlyImportError( "Failed to create XML reader for file" + pFile + "." );
    }
    mReader->registerVocabulary("urn:web3d:x3d:fi-vocabulary-3.2", &X3D_vocabulary_3_2);
    mReader->registerVocabulary("urn:web3d:x3d:fi-vocabulary-3.3", &X3D_vocabulary_3_3);
	// start reading
	ParseNode_Root();

	// restore old XMLreader
	mReader = std::move(OldReader);
}